

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void ** __thiscall icu_63::UVector::toArray(UVector *this,void **result)

{
  int local_24;
  UElement *pUStack_20;
  int i;
  void **a;
  void **result_local;
  UVector *this_local;
  
  pUStack_20 = (UElement *)result;
  for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
    *pUStack_20 = this->elements[local_24];
    pUStack_20 = pUStack_20 + 1;
  }
  return result;
}

Assistant:

void** UVector::toArray(void** result) const {
    void** a = result;
    for (int i=0; i<count; ++i) {
        *a++ = elements[i].pointer;
    }
    return result;
}